

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O1

CURLcode on_resp_header(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict *ts,char *header)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  
  iVar3 = curl_strnequal(header,"WWW-Authenticate:",0x11);
  if (((iVar3 != 0) && ((data->req).httpcode == 0x191)) ||
     ((iVar3 = curl_strnequal(header,"Proxy-authenticate:",0x13), iVar3 != 0 &&
      ((data->req).httpcode == 0x197)))) {
    iVar3 = (data->req).httpcode;
    pcVar5 = Curl_copy_header_value(header);
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"CONNECT: fwd auth header \'%s\'",header);
    }
    CVar4 = Curl_http_input_auth(data,iVar3 == 0x197,pcVar5);
    (*Curl_cfree)(pcVar5);
    return CVar4;
  }
  iVar3 = curl_strnequal(header,"Content-Length:",0xf);
  if (iVar3 == 0) {
    _Var2 = Curl_compareheader(header,"Connection:",0xb,"close",5);
    if (!_Var2) {
      iVar3 = curl_strnequal(header,"Transfer-Encoding:",0x12);
      if (iVar3 != 0) {
        if (99 < (data->req).httpcode - 200U) {
          _Var2 = Curl_compareheader(header,"Transfer-Encoding:",0x12,"chunked",7);
          if (!_Var2) {
            return CURLE_OK;
          }
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"CONNECT responded chunked");
          }
          ts->field_0x11c = ts->field_0x11c | 1;
          Curl_httpchunk_reset(data,&ts->ch,true);
          return CURLE_OK;
        }
        if (data == (Curl_easy *)0x0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x8bd & 0x10) == 0) {
          return CURLE_OK;
        }
        pcVar5 = "Ignoring Transfer-Encoding in CONNECT %03d response";
        goto LAB_006bc25c;
      }
      _Var2 = Curl_compareheader(header,"Proxy-Connection:",0x11,"close",5);
      if (!_Var2) {
        iVar3 = strncmp(header,"HTTP/1.",7);
        if (iVar3 != 0) {
          return CURLE_OK;
        }
        if ((header[7] & 0xfeU) != 0x30) {
          return CURLE_OK;
        }
        if (header[8] != ' ') {
          return CURLE_OK;
        }
        if (9 < (byte)(header[9] - 0x30U)) {
          return CURLE_OK;
        }
        bVar1 = header[10];
        if (9 < (byte)(bVar1 - 0x30)) {
          return CURLE_OK;
        }
        if (9 < (byte)(header[0xb] - 0x30U)) {
          return CURLE_OK;
        }
        if ((byte)(header[0xc] - 0x30U) < 10) {
          return CURLE_OK;
        }
        iVar3 = (uint)(byte)header[9] * 100 + ((uint)bVar1 + (uint)bVar1 * 4) * 2 +
                (uint)(byte)header[0xb] + -0x14d0;
        (data->req).httpcode = iVar3;
        (data->info).httpproxycode = iVar3;
        return CURLE_OK;
      }
    }
    ts->field_0x11c = ts->field_0x11c | 2;
  }
  else {
    if (99 < (data->req).httpcode - 200U) {
      curlx_strtoofft(header + 0xf,(char **)0x0,10,&ts->cl);
      return CURLE_OK;
    }
    if (data == (Curl_easy *)0x0) {
      return CURLE_OK;
    }
    if (((data->set).field_0x8bd & 0x10) == 0) {
      return CURLE_OK;
    }
    pcVar5 = "Ignoring Content-Length in CONNECT %03d response";
LAB_006bc25c:
    Curl_infof(data,pcVar5);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode on_resp_header(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               struct h1_tunnel_state *ts,
                               const char *header)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  (void)cf;

  if((checkprefix("WWW-Authenticate:", header) &&
      (401 == k->httpcode)) ||
     (checkprefix("Proxy-authenticate:", header) &&
      (407 == k->httpcode))) {

    bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
    char *auth = Curl_copy_header_value(header);
    if(!auth)
      return CURLE_OUT_OF_MEMORY;

    CURL_TRC_CF(data, cf, "CONNECT: fwd auth header '%s'", header);
    result = Curl_http_input_auth(data, proxy, auth);

    free(auth);

    if(result)
      return result;
  }
  else if(checkprefix("Content-Length:", header)) {
    if(k->httpcode/100 == 2) {
      /* A client MUST ignore any Content-Length or Transfer-Encoding
         header fields received in a successful response to CONNECT.
         "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
      infof(data, "Ignoring Content-Length in CONNECT %03d response",
            k->httpcode);
    }
    else {
      (void)curlx_strtoofft(header + strlen("Content-Length:"),
                            NULL, 10, &ts->cl);
    }
  }
  else if(Curl_compareheader(header,
                             STRCONST("Connection:"), STRCONST("close")))
    ts->close_connection = TRUE;
  else if(checkprefix("Transfer-Encoding:", header)) {
    if(k->httpcode/100 == 2) {
      /* A client MUST ignore any Content-Length or Transfer-Encoding
         header fields received in a successful response to CONNECT.
         "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
      infof(data, "Ignoring Transfer-Encoding in "
            "CONNECT %03d response", k->httpcode);
    }
    else if(Curl_compareheader(header,
                               STRCONST("Transfer-Encoding:"),
                               STRCONST("chunked"))) {
      infof(data, "CONNECT responded chunked");
      ts->chunked_encoding = TRUE;
      /* reset our chunky engine */
      Curl_httpchunk_reset(data, &ts->ch, TRUE);
    }
  }
  else if(Curl_compareheader(header,
                             STRCONST("Proxy-Connection:"),
                             STRCONST("close")))
    ts->close_connection = TRUE;
  else if(!strncmp(header, "HTTP/1.", 7) &&
          ((header[7] == '0') || (header[7] == '1')) &&
          (header[8] == ' ') &&
          ISDIGIT(header[9]) && ISDIGIT(header[10]) && ISDIGIT(header[11]) &&
          !ISDIGIT(header[12])) {
    /* store the HTTP code from the proxy */
    data->info.httpproxycode =  k->httpcode = (header[9] - '0') * 100 +
      (header[10] - '0') * 10 + (header[11] - '0');
  }
  return result;
}